

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O0

int dwarf_get_section_info_by_name_a
              (Dwarf_Debug dbg,char *section_name,Dwarf_Addr *section_addr,
              Dwarf_Unsigned *section_size,Dwarf_Unsigned *section_flags,
              Dwarf_Unsigned *section_offset,Dwarf_Error *error)

{
  Dwarf_Obj_Access_Interface_a_s *pDVar1;
  int iVar2;
  Dwarf_Unsigned DVar3;
  int local_ac;
  int res;
  int errnum;
  Dwarf_Obj_Access_Section_a_s doas;
  Dwarf_Unsigned section_index;
  Dwarf_Unsigned section_count;
  Dwarf_Obj_Access_Interface_a_s *obj;
  Dwarf_Unsigned *section_offset_local;
  Dwarf_Unsigned *section_flags_local;
  Dwarf_Unsigned *section_size_local;
  Dwarf_Addr *section_addr_local;
  char *section_name_local;
  Dwarf_Debug dbg_local;
  
  doas.as_entrysize = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_section_info_by_name_a()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    if (section_addr != (Dwarf_Addr *)0x0) {
      *section_addr = 0;
    }
    if (section_size != (Dwarf_Unsigned *)0x0) {
      *section_size = 0;
    }
    if (section_flags != (Dwarf_Unsigned *)0x0) {
      *section_flags = 0;
    }
    if (section_offset != (Dwarf_Unsigned *)0x0) {
      *section_offset = 0;
    }
    if (section_name == (char *)0x0) {
      _dwarf_error_string(dbg,error,0x51,
                          "DW_DLE_DBG_NULL: null section_name pointer passed to dwarf_get_section_info_by_name_a"
                         );
      dbg_local._4_4_ = 1;
    }
    else if (*section_name == '\0') {
      dbg_local._4_4_ = -1;
    }
    else {
      pDVar1 = dbg->de_obj_file;
      if (pDVar1 == (Dwarf_Obj_Access_Interface_a_s *)0x0) {
        dbg_local._4_4_ = -1;
      }
      else {
        DVar3 = (*pDVar1->ai_methods->om_get_section_count)(pDVar1->ai_object);
        for (doas.as_entrysize = 0; doas.as_entrysize < DVar3;
            doas.as_entrysize = doas.as_entrysize + 1) {
          local_ac = 0;
          memcpy(&res,&zerodoas,0x50);
          iVar2 = (*pDVar1->ai_methods->om_get_section_info)
                            (pDVar1->ai_object,doas.as_entrysize,(Dwarf_Obj_Access_Section_a *)&res,
                             &local_ac);
          if (iVar2 == 1) {
            _dwarf_error(dbg,error,(long)local_ac);
            return 1;
          }
          if ((iVar2 != -1) && (iVar2 = strcmp(section_name,_res), iVar2 == 0)) {
            if (section_addr != (Dwarf_Addr *)0x0) {
              *section_addr = doas.as_flags;
            }
            if (section_size != (Dwarf_Unsigned *)0x0) {
              *section_size = doas.as_offset;
            }
            if (section_flags != (Dwarf_Unsigned *)0x0) {
              *section_flags = doas.as_type;
            }
            if (section_offset != (Dwarf_Unsigned *)0x0) {
              *section_offset = doas.as_addr;
            }
            return 0;
          }
        }
        dbg_local._4_4_ = -1;
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_section_info_by_name_a(Dwarf_Debug dbg,
    const char *section_name,
    Dwarf_Addr *section_addr,
    Dwarf_Unsigned *section_size,
    Dwarf_Unsigned *section_flags,
    Dwarf_Unsigned *section_offset,
    Dwarf_Error * error)
{
    struct Dwarf_Obj_Access_Interface_a_s * obj = 0;
    Dwarf_Unsigned section_count = 0;
    Dwarf_Unsigned section_index = 0;
    struct Dwarf_Obj_Access_Section_a_s doas;

    CHECK_DBG(dbg,error,"dwarf_get_section_info_by_name_a()");
    if (section_addr) {
        *section_addr = 0;
    }
    if (section_size) {
        *section_size = 0;
    }
    if (section_flags) {
        *section_flags = 0;
    }
    if (section_offset) {
        *section_offset = 0;
    }
    if (!section_name) {
        _dwarf_error_string(dbg,error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: null section_name pointer "
            "passed to "
            "dwarf_get_section_info_by_name_a");
        return DW_DLV_ERROR;
    }
    if (!section_name[0]) {
        return DW_DLV_NO_ENTRY;
    }
    obj = dbg->de_obj_file;
    if (!obj) {
        return DW_DLV_NO_ENTRY;
    }
    section_count = obj->ai_methods->
        om_get_section_count(obj->ai_object);

    /*  We can skip index 0 when considering ELF files, but not other
        object types. */
    for (section_index = 0; section_index < section_count;
        ++section_index) {
        int errnum = 0;
        int res = 0;

        doas = zerodoas;
        res = obj->ai_methods->
            om_get_section_info(obj->ai_object,
            section_index, &doas, &errnum);
        if (res == DW_DLV_ERROR) {
            DWARF_DBG_ERROR(dbg, errnum, DW_DLV_ERROR);
        }
        if (res == DW_DLV_NO_ENTRY) {
            /* This should be impossible */
            continue;
        }
        if (!strcmp(section_name,doas.as_name)) {
            if (section_addr) {
                *section_addr = doas.as_addr;
            }
            if (section_size) {
                *section_size = doas.as_size;
            }
            if (section_flags) {
                *section_flags = doas.as_flags;
            }
            if (section_offset) {
                *section_offset = doas.as_offset;
            }
            return DW_DLV_OK;
        }
    }
    return DW_DLV_NO_ENTRY;
}